

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

bool __thiscall Clasp::SharedContext::addBinary(SharedContext *this,Literal x,Literal y)

{
  Result RVar1;
  Literal lits [2];
  Literal local_18;
  uint32 local_14;
  ClauseRep local_10;
  
  local_10.lits = &local_18;
  if (((uint)this->share_ & 0x3fe) == 0 || ((uint)this->share_ >> 0x19 & 1) == 0) {
    local_10.info.super_ConstraintScore.rep = (ConstraintScore)0x0;
    local_10._4_4_ = 2;
    local_18.rep_ = x.rep_;
    local_14 = y.rep_;
    RVar1 = ClauseCreator::create(*(this->solvers_).ebo_.buf,&local_10,0x100);
    return ((undefined1  [16])RVar1 & (undefined1  [16])0x2) == (undefined1  [16])0x0;
  }
  Potassco::fail(-2,"bool Clasp::SharedContext::addBinary(Literal, Literal)",0x3d4,
                 "allowImplicit(Constraint_t::Static)",(char *)0x0);
}

Assistant:

bool SharedContext::addBinary(Literal x, Literal y) {
	POTASSCO_REQUIRE(allowImplicit(Constraint_t::Static));
	Literal lits[2] = {x, y};
	return ClauseCreator::create(*master(), ClauseRep(lits, 2), ClauseCreator::clause_force_simplify);
}